

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

const_reference __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
::front(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
        *this)

{
  ulong uVar1;
  const_reference pQVar2;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if (1 < uVar1) {
    if ((uVar1 & 1) == 0) {
      pQVar2 = (const_reference)&this->rep_;
    }
    else {
      pQVar2 = *(const_reference *)((long)&this->rep_ + 8);
    }
    return pQVar2;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x11c,
                "const_reference absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, 16>::front() const [T = S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, N = 16, A = std::allocator<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry>]"
               );
}

Assistant:

size_type size() const { return size_ / 2; }